

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem>
          (QPodArrayOps<QToolBarAreaLayoutItem> *this,qsizetype i,QToolBarAreaLayoutItem *args)

{
  QToolBarAreaLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QLayoutItem *pQVar4;
  QToolBarAreaLayoutItem *pQVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  undefined3 uVar10;
  QToolBarAreaLayoutItem *pQVar11;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004b3ef7:
    pQVar4 = args->widgetItem;
    iVar6 = args->pos;
    iVar7 = args->size;
    iVar8 = args->preferredSize;
    bVar9 = args->gap;
    uVar10 = *(undefined3 *)&args->field_0x15;
    where = (GrowthPosition)
            (i == 0 && (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size != 0);
    QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QToolBarAreaLayoutItem>,where,1,
               (QToolBarAreaLayoutItem **)0x0,(QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0);
    pQVar11 = createHole(this,where,i,1);
    pQVar11->widgetItem = pQVar4;
    pQVar11->pos = iVar6;
    pQVar11->size = iVar7;
    pQVar11->preferredSize = iVar8;
    pQVar11->gap = bVar9;
    *(undefined3 *)&pQVar11->field_0x15 = uVar10;
  }
  else {
    if (((this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size == i) &&
       (pQVar11 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar11 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      bVar9 = args->gap;
      uVar10 = *(undefined3 *)&args->field_0x15;
      pQVar5 = pQVar11 + i;
      pQVar5->preferredSize = args->preferredSize;
      pQVar5->gap = bVar9;
      *(undefined3 *)&pQVar5->field_0x15 = uVar10;
      iVar6 = args->pos;
      iVar7 = args->size;
      pQVar11 = pQVar11 + i;
      pQVar11->widgetItem = args->widgetItem;
      pQVar11->pos = iVar6;
      pQVar11->size = iVar7;
    }
    else {
      if ((i != 0) ||
         (pQVar11 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr,
         (QToolBarAreaLayoutItem *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar11))
      goto LAB_004b3ef7;
      bVar9 = args->gap;
      uVar10 = *(undefined3 *)&args->field_0x15;
      pQVar11[-1].preferredSize = args->preferredSize;
      pQVar11[-1].gap = bVar9;
      *(undefined3 *)&pQVar11[-1].field_0x15 = uVar10;
      iVar6 = args->pos;
      iVar7 = args->size;
      pQVar11[-1].widgetItem = args->widgetItem;
      pQVar11[-1].pos = iVar6;
      pQVar11[-1].size = iVar7;
      ppQVar1 = &(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }